

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O1

AnyCellmlElementPtr __thiscall libcellml::Issue::item(Issue *this)

{
  IssueImpl *pIVar1;
  AnyCellmlElementImpl *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  AnyCellmlElementPtr AVar4;
  AnyCellmlElementPtr AVar5;
  
  pIVar1 = this->mPimpl;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (pIVar1->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  in_RDI->mPimpl = (AnyCellmlElementImpl *)_Var3._M_pi;
  pAVar2 = (AnyCellmlElementImpl *)
           (pIVar1->mItem).
           super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  in_RDI[1].mPimpl = pAVar2;
  if (pAVar2 != (AnyCellmlElementImpl *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&(pAVar2->mItem)._M_manager = *(int *)&(pAVar2->mItem)._M_manager + 1;
      AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (AnyCellmlElementPtr)
             AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)&(pAVar2->mItem)._M_manager = *(int *)&(pAVar2->mItem)._M_manager + 1;
    UNLOCK();
  }
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (AnyCellmlElementPtr)
         AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Issue::item() const
{
    return mPimpl->mItem;
}